

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pg_functions.cpp
# Opt level: O0

void duckdb_libpgquery::allocate_new(parser_state *state,size_t n)

{
  long lVar1;
  void *pvVar2;
  bad_alloc *this;
  undefined8 uVar3;
  ulong in_RSI;
  long in_RDI;
  char *base_ptr;
  char **new_malloc_ptrs;
  size_t new_size;
  bad_alloc *in_stack_ffffffffffffffd0;
  size_t local_10;
  
  if (*(ulong *)(in_RDI + 0x2020) <= *(ulong *)(in_RDI + 0x2010)) {
    lVar1 = *(long *)(in_RDI + 0x2020);
    pvVar2 = malloc(lVar1 << 4);
    if (pvVar2 == (void *)0x0) {
      this = (bad_alloc *)__cxa_allocate_exception(8);
      duckdb::std::bad_alloc::bad_alloc(this);
      __cxa_throw(this,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    memset(pvVar2,0,lVar1 << 4);
    memcpy(pvVar2,*(void **)(in_RDI + 0x2018),*(long *)(in_RDI + 0x2020) << 3);
    free(*(void **)(in_RDI + 0x2018));
    *(long *)(in_RDI + 0x2020) = lVar1 << 1;
    *(void **)(in_RDI + 0x2018) = pvVar2;
  }
  local_10 = in_RSI;
  if (in_RSI < 0x2800) {
    local_10 = 0x2800;
  }
  pvVar2 = malloc(local_10);
  if (pvVar2 == (void *)0x0) {
    uVar3 = __cxa_allocate_exception(8);
    duckdb::std::bad_alloc::bad_alloc(in_stack_ffffffffffffffd0);
    __cxa_throw(uVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  *(void **)(*(long *)(in_RDI + 0x2018) + *(long *)(in_RDI + 0x2010) * 8) = pvVar2;
  *(long *)(in_RDI + 0x2010) = *(long *)(in_RDI + 0x2010) + 1;
  *(undefined8 *)(in_RDI + 0x2008) = 0;
  return;
}

Assistant:

static void allocate_new(parser_state *state, size_t n) {
	if (state->malloc_ptr_idx >= state->malloc_ptr_size) {
		size_t new_size = state->malloc_ptr_size * 2;
		auto new_malloc_ptrs = (char **) malloc(sizeof(char *) * new_size);
		if (!new_malloc_ptrs) {
			throw std::bad_alloc();
		}
		memset(new_malloc_ptrs, 0, sizeof(char*) * new_size);
		memcpy(new_malloc_ptrs, state->malloc_ptrs, state->malloc_ptr_size * sizeof(char*));
		free(state->malloc_ptrs);
		state->malloc_ptr_size = new_size;
		state->malloc_ptrs = new_malloc_ptrs;
	}
	if (n < PG_MALLOC_SIZE) {
		n = PG_MALLOC_SIZE;
	}
	auto base_ptr = (char *)malloc(n);
	if (!base_ptr) {
		throw std::bad_alloc();
	}
	state->malloc_ptrs[state->malloc_ptr_idx] = base_ptr;
	state->malloc_ptr_idx++;
	state->malloc_pos = 0;
}